

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O2

BOOL __thiscall
Js::DynamicObject::SetObjectArrayItemAttributes
          (DynamicObject *this,uint32 index,PropertyAttributes attributes)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  bVar1 = HasObjectArray(this);
  if (bVar1) {
    iVar2 = (**(code **)(**(long **)&(this->field_1).field_1 + 0x360))
                      (*(long **)&(this->field_1).field_1,index,attributes);
    uVar3 = (uint)(iVar2 != 0);
    if (((attributes & 4) == 0) && (iVar2 != 0)) {
      InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype(this);
    }
  }
  else {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

BOOL DynamicObject::SetObjectArrayItemAttributes(uint32 index, PropertyAttributes attributes)
    {
        const auto result = HasObjectArray() && GetObjectArrayOrFlagsAsArray()->SetItemAttributes(index, attributes);

        // We don't track non-enumerable items in object arrays.  Any object with an object array reports having
        // enumerable properties.  See comment in DynamicObject::GetHasNoEnumerableProperties.
        //if (attributes & PropertyEnumerable)
        //{
        //    SetHasNoEnumerableProperties(false);
        //}

        if (!(attributes & PropertyWritable) && result)
        {
            InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype();
        }
        return result;
    }